

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O2

void __thiscall
draco::VertexCornersIterator<draco::MeshAttributeCornerTable>::Next
          (VertexCornersIterator<draco::MeshAttributeCornerTable> *this)

{
  CornerIndex CVar1;
  
  CVar1.value_ = (this->corner_).value_;
  if (this->left_traversal_ == true) {
    CVar1 = MeshAttributeCornerTable::SwingLeft(this->corner_table_,CVar1);
    (this->corner_).value_ = CVar1.value_;
    if (CVar1.value_ == 0xffffffff) {
      CVar1 = MeshAttributeCornerTable::SwingRight(this->corner_table_,(this->start_corner_).value_)
      ;
      (this->corner_).value_ = CVar1.value_;
      this->left_traversal_ = false;
    }
    else if (CVar1.value_ == (this->start_corner_).value_) {
      (this->corner_).value_ = 0xffffffff;
    }
  }
  else {
    CVar1 = MeshAttributeCornerTable::SwingRight(this->corner_table_,CVar1);
    (this->corner_).value_ = CVar1.value_;
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = corner_table_->SwingRight(start_corner_);
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }